

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observernotifier.cpp
# Opt level: O2

void __thiscall
camp::detail::ObserverNotifier::notifyClassAdded(ObserverNotifier *this,Class *theClass)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->m_observers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_observers)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 1) + 0x10))(*(long **)(p_Var1 + 1),theClass);
  }
  return;
}

Assistant:

void ObserverNotifier::notifyClassAdded(const Class& theClass)
{
    for (ObserverSet::iterator it = m_observers.begin(); it != m_observers.end(); ++it)
    {
        (*it)->classAdded(theClass);
    }
}